

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O2

void __thiscall bloaty::anon_unknown_0::ElfFile::ElfFile(ElfFile *this,string_view data)

{
  Elf64_Half *pEVar1;
  byte bVar2;
  uint64_t uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Elf64_Addr EVar6;
  Elf64_Off EVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  ushort uVar11;
  uint64_t uVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  int *piVar16;
  ushort uVar17;
  bloaty *this_00;
  bool bVar18;
  ushort uVar19;
  uint uVar20;
  Arg *in_R8;
  ushort uVar21;
  Elf64_Off EVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  string_view sVar28;
  string_view data_00;
  string_view format;
  string_view format_00;
  string local_a8;
  Section local_88;
  
  piVar16 = (int *)data._M_str;
  this_00 = (bloaty *)data._M_len;
  (this->data_)._M_len = (size_t)this_00;
  (this->data_)._M_str = (char *)piVar16;
  (this->section_name_table_).contents_._M_len = 0;
  (this->section_name_table_).contents_._M_str = (char *)0x0;
  (this->section_name_table_).range_._M_len = 0;
  (this->section_name_table_).range_._M_str = (char *)0x0;
  (this->header_region_)._M_len = 0;
  (this->header_region_)._M_str = (char *)0x0;
  (this->section_headers_)._M_len = 0;
  (this->section_headers_)._M_str = (char *)0x0;
  (this->segment_headers_)._M_len = 0;
  (this->segment_headers_)._M_str = (char *)0x0;
  if ((this_00 < (bloaty *)0x10) || (*piVar16 != 0x464c457f)) {
    bVar10 = false;
  }
  else {
    bVar2 = *(byte *)(piVar16 + 1);
    bVar13 = *(byte *)((long)piVar16 + 5);
    bVar18 = false;
    bVar10 = false;
    if (bVar2 != 1) {
      if (bVar2 != 2) {
        absl::substitute_internal::Arg::Arg((Arg *)&local_88,(uint)bVar2);
        format._M_str = (char *)&local_88;
        format._M_len = (size_t)"unexpected ELF class: $0";
        absl::Substitute_abi_cxx11_(&local_a8,(absl *)0x18,format,in_R8);
        Throw(local_a8._M_dataplus._M_p,0x1d2);
      }
      bVar18 = true;
      bVar10 = true;
    }
    this->is_64bit_ = bVar18;
    bVar18 = true;
    if (bVar13 != 1) {
      if (bVar13 != 2) {
        absl::substitute_internal::Arg::Arg((Arg *)&local_88,(uint)bVar13);
        format_00._M_str = (char *)&local_88;
        format_00._M_len = (size_t)"unexpected ELF data: $0";
        absl::Substitute_abi_cxx11_(&local_a8,(absl *)0x17,format_00,in_R8);
        Throw(local_a8._M_dataplus._M_p,0x1dd);
      }
      bVar13 = false;
      bVar18 = false;
    }
    this->is_native_endian_ = (bool)bVar13;
    if (bVar10) {
      data_00._M_str = (char *)0x0;
      data_00._M_len = (size_t)piVar16;
      StrictSubstr(this_00,data_00,0x40,(size_t)in_R8);
      uVar4 = *(undefined8 *)(piVar16 + 2);
      uVar5 = *(undefined8 *)(piVar16 + 4);
      EVar6 = *(Elf64_Addr *)(piVar16 + 6);
      EVar22 = *(Elf64_Off *)(piVar16 + 8);
      EVar7 = *(Elf64_Off *)(piVar16 + 10);
      uVar8 = *(undefined8 *)(piVar16 + 0xc);
      uVar9 = *(undefined8 *)(piVar16 + 0xe);
      *(undefined8 *)(this->header_).e_ident = *(undefined8 *)piVar16;
      *(undefined8 *)((this->header_).e_ident + 8) = uVar4;
      (this->header_).e_type = (short)uVar5;
      (this->header_).e_machine = (short)((ulong)uVar5 >> 0x10);
      (this->header_).e_version = (int)((ulong)uVar5 >> 0x20);
      (this->header_).e_entry = EVar6;
      (this->header_).e_phoff = EVar22;
      (this->header_).e_shoff = EVar7;
      (this->header_).e_flags = (int)uVar8;
      (this->header_).e_ehsize = (short)((ulong)uVar8 >> 0x20);
      (this->header_).e_phentsize = (short)((ulong)uVar8 >> 0x30);
      (this->header_).e_phnum = (short)uVar9;
      (this->header_).e_shentsize = (short)((ulong)uVar9 >> 0x10);
      (this->header_).e_shnum = (short)((ulong)uVar9 >> 0x20);
      (this->header_).e_shstrndx = (short)((ulong)uVar9 >> 0x30);
      if (bVar18) {
        EVar22 = (this->header_).e_shoff;
      }
      else {
        pEVar1 = &(this->header_).e_type;
        *pEVar1 = *pEVar1 << 8 | *pEVar1 >> 8;
        pEVar1 = &(this->header_).e_machine;
        *pEVar1 = *pEVar1 << 8 | *pEVar1 >> 8;
        uVar14 = (this->header_).e_version;
        (this->header_).e_version =
             uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
        uVar25 = (this->header_).e_entry;
        (this->header_).e_entry =
             uVar25 >> 0x38 | (uVar25 & 0xff000000000000) >> 0x28 |
             (uVar25 & 0xff0000000000) >> 0x18 | (uVar25 & 0xff00000000) >> 8 |
             (uVar25 & 0xff000000) << 8 | (uVar25 & 0xff0000) << 0x18 | (uVar25 & 0xff00) << 0x28 |
             uVar25 << 0x38;
        uVar25 = (this->header_).e_phoff;
        (this->header_).e_phoff =
             uVar25 >> 0x38 | (uVar25 & 0xff000000000000) >> 0x28 |
             (uVar25 & 0xff0000000000) >> 0x18 | (uVar25 & 0xff00000000) >> 8 |
             (uVar25 & 0xff000000) << 8 | (uVar25 & 0xff0000) << 0x18 | (uVar25 & 0xff00) << 0x28 |
             uVar25 << 0x38;
        uVar25 = (this->header_).e_shoff;
        EVar22 = uVar25 >> 0x38 | (uVar25 & 0xff000000000000) >> 0x28 |
                 (uVar25 & 0xff0000000000) >> 0x18 | (uVar25 & 0xff00000000) >> 8 |
                 (uVar25 & 0xff000000) << 8 | (uVar25 & 0xff0000) << 0x18 |
                 (uVar25 & 0xff00) << 0x28 | uVar25 << 0x38;
        (this->header_).e_shoff = EVar22;
        uVar14 = (this->header_).e_flags;
        (this->header_).e_flags =
             uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
        uVar25._0_2_ = (this->header_).e_ehsize;
        uVar25._2_2_ = (this->header_).e_phentsize;
        uVar25._4_2_ = (this->header_).e_phnum;
        uVar25._6_2_ = (this->header_).e_shentsize;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = uVar25;
        auVar27 = psllw(auVar26,8);
        uVar25 = auVar27._0_8_ |
                 CONCAT26((ushort)uVar25._6_2_ >> 8,
                          CONCAT24((ushort)uVar25._4_2_ >> 8,
                                   CONCAT22((ushort)uVar25._2_2_ >> 8,
                                            (ushort)(undefined2)uVar25 >> 8)));
        (this->header_).e_ehsize = (short)uVar25;
        (this->header_).e_phentsize = (short)(uVar25 >> 0x10);
        (this->header_).e_phnum = (short)(uVar25 >> 0x20);
        (this->header_).e_shentsize = (short)(uVar25 >> 0x30);
        pEVar1 = &(this->header_).e_shnum;
        *pEVar1 = *pEVar1 << 8 | *pEVar1 >> 8;
        pEVar1 = &(this->header_).e_shstrndx;
        *pEVar1 = *pEVar1 << 8 | *pEVar1 >> 8;
      }
    }
    else {
      sVar28._M_str = (char *)0x0;
      sVar28._M_len = (size_t)piVar16;
      StrictSubstr(this_00,sVar28,0x34,(size_t)in_R8);
      uVar21 = *(ushort *)(piVar16 + 4);
      uVar11 = *(ushort *)((long)piVar16 + 0x12);
      uVar14 = piVar16[5];
      uVar20 = piVar16[6];
      uVar23 = piVar16[7];
      uVar24 = piVar16[8];
      uVar15 = piVar16[9];
      uVar25 = *(ulong *)(piVar16 + 10);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uVar25;
      uVar17 = *(ushort *)(piVar16 + 0xc);
      uVar19 = *(ushort *)((long)piVar16 + 0x32);
      uVar4 = *(undefined8 *)(piVar16 + 2);
      bVar10 = this->is_native_endian_;
      *(undefined8 *)(this->header_).e_ident = *(undefined8 *)piVar16;
      *(undefined8 *)((this->header_).e_ident + 8) = uVar4;
      if (bVar10 == false) {
        uVar21 = uVar21 << 8 | uVar21 >> 8;
        uVar11 = uVar11 << 8 | uVar11 >> 8;
        uVar14 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18
        ;
        uVar20 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 | uVar20 << 0x18
        ;
        uVar23 = uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 | uVar23 << 0x18
        ;
        uVar24 = uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8 | uVar24 << 0x18
        ;
        uVar15 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18
        ;
        auVar27 = psllw(auVar27,8);
        uVar25 = auVar27._0_8_ |
                 CONCAT26((ushort)(uVar25 >> 0x38),
                          CONCAT24((ushort)(uVar25 >> 0x20) >> 8,
                                   CONCAT22((ushort)(uVar25 >> 0x10) >> 8,(ushort)uVar25 >> 8)));
        uVar17 = uVar17 << 8 | uVar17 >> 8;
        uVar19 = uVar19 << 8 | uVar19 >> 8;
      }
      (this->header_).e_type = uVar21;
      EVar22 = (Elf64_Off)uVar24;
      (this->header_).e_machine = uVar11;
      (this->header_).e_version = uVar14;
      (this->header_).e_entry = (ulong)uVar20;
      (this->header_).e_phoff = (ulong)uVar23;
      (this->header_).e_shoff = EVar22;
      (this->header_).e_flags = uVar15;
      (this->header_).e_ehsize = (short)uVar25;
      (this->header_).e_phentsize = (short)(uVar25 >> 0x10);
      (this->header_).e_phnum = (short)(uVar25 >> 0x20);
      (this->header_).e_shentsize = (short)(uVar25 >> 0x30);
      (this->header_).e_shnum = uVar17;
      (this->header_).e_shstrndx = uVar19;
    }
    local_88.range_._M_len = 0;
    local_88.range_._M_str = (char *)0x0;
    local_88.contents_._M_len = 0;
    local_88.contents_._M_str = (char *)0x0;
    bVar2 = 1;
    if ((EVar22 != 0) && (EVar22 + (this->header_).e_shentsize < (this->data_)._M_len)) {
      this->section_count_ = 1;
      bVar2 = 0;
      ReadSection(this,0,&local_88);
    }
    uVar25 = (ulong)(this->header_).e_shnum;
    this->section_count_ = uVar25;
    uVar21 = (this->header_).e_shstrndx;
    this->section_string_index_ = (ulong)uVar21;
    if (!(bool)(uVar25 != 0 | bVar2)) {
      this->section_count_ = local_88.header_.sh_size;
    }
    if (!(bool)(bVar2 | uVar21 != 0xffff)) {
      this->section_string_index_ = (ulong)local_88.header_.sh_link;
    }
    sVar28 = GetRegion(this,0,(ulong)(this->header_).e_ehsize);
    this->header_region_ = sVar28;
    uVar3 = (this->header_).e_shoff;
    uVar12 = CheckedMul((ulong)(this->header_).e_shentsize,this->section_count_);
    sVar28 = GetRegion(this,uVar3,uVar12);
    this->section_headers_ = sVar28;
    uVar3 = (this->header_).e_phoff;
    uVar12 = CheckedMul((ulong)(this->header_).e_phentsize,(ulong)(this->header_).e_phnum);
    sVar28 = GetRegion(this,uVar3,uVar12);
    this->segment_headers_ = sVar28;
    if (this->section_count_ != 0) {
      ReadSection(this,(Elf64_Word)this->section_string_index_,&this->section_name_table_);
      if ((this->section_name_table_).header_.sh_type != 3) {
        Throw("section string index pointed to non-strtab",0x204);
      }
    }
    bVar10 = true;
  }
  this->ok_ = bVar10;
  return;
}

Assistant:

ElfFile(string_view data) : data_(data) {
    ok_ = Initialize();
  }